

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhexutils.cpp
# Opt level: O3

bool QHexUtils::PatternUtils::match(QByteArray *data,QString *pattern)

{
  bool bVar1;
  char cVar2;
  bool bVar3;
  CutResult CVar4;
  ulong uVar5;
  qsizetype qVar6;
  QGlobalStatic<QString,_QHexUtils::PatternUtils::(anonymous_namespace)::Q_QGS_WILDCARD_BYTE::innerFunction,_QHexUtils::PatternUtils::(anonymous_namespace)::Q_QGS_WILDCARD_BYTE::guard>
  *this;
  long lVar7;
  char16_t *pcVar8;
  long lVar9;
  QStringView QVar10;
  QStringView QVar11;
  QStringView QVar12;
  bool ok;
  ulong local_40;
  qsizetype local_38;
  
  this = (QGlobalStatic<QString,_QHexUtils::PatternUtils::(anonymous_namespace)::Q_QGS_WILDCARD_BYTE::innerFunction,_QHexUtils::PatternUtils::(anonymous_namespace)::Q_QGS_WILDCARD_BYTE::guard>
          *)(pattern->d).size;
  bVar3 = (long)this < 2;
  if ((1 < (long)this) && (0 < (data->d).size)) {
    lVar7 = 2;
    lVar9 = 1;
    do {
      local_40 = lVar7 - 2;
      pcVar8 = (pattern->d).ptr;
      local_38 = 2;
      CVar4 = QtPrivate::QContainerImplHelper::mid((qsizetype)this,(qsizetype *)&local_40,&local_38)
      ;
      if (CVar4 == Null) {
        qVar6 = 0;
        pcVar8 = (char16_t *)0x0;
      }
      else {
        pcVar8 = pcVar8 + local_40;
        qVar6 = local_38;
      }
      _GLOBAL__N_1::
      QGlobalStatic<QString,_QHexUtils::PatternUtils::(anonymous_namespace)::Q_QGS_WILDCARD_BYTE::innerFunction,_QHexUtils::PatternUtils::(anonymous_namespace)::Q_QGS_WILDCARD_BYTE::guard>
      ::operator*(this);
      if ((qVar6 != (anonymous_namespace)::Q_QGS_WILDCARD_BYTE::innerFunction()::holder._16_8_) ||
         (QVar10.m_data = pcVar8, QVar10.m_size = qVar6,
         QVar12.m_data =
              (storage_type_conflict *)
              (anonymous_namespace)::Q_QGS_WILDCARD_BYTE::innerFunction()::holder._8_8_,
         QVar12.m_size = qVar6, cVar2 = QtPrivate::equalStrings(QVar10,QVar12), cVar2 == '\0')) {
        local_40 = local_40 & 0xffffffffffffff00;
        QVar11.m_data = pcVar8;
        QVar11.m_size = qVar6;
        uVar5 = QString::toIntegral_helper(QVar11,(bool *)&local_40,0x10);
        if ((uVar5 >> 0x20 != 0) ||
           (((local_40 & 1) == 0 || ((char)uVar5 != (data->d).ptr[lVar9 + -1])))) {
          return false;
        }
      }
      this = (QGlobalStatic<QString,_QHexUtils::PatternUtils::(anonymous_namespace)::Q_QGS_WILDCARD_BYTE::innerFunction,_QHexUtils::PatternUtils::(anonymous_namespace)::Q_QGS_WILDCARD_BYTE::guard>
              *)(pattern->d).size;
      bVar3 = (long)(this + -2) < lVar7;
      if ((long)(this + -2) < lVar7) {
        return bVar3;
      }
      lVar7 = lVar7 + 2;
      bVar1 = lVar9 < (data->d).size;
      lVar9 = lVar9 + 1;
    } while (bVar1);
  }
  return bVar3;
}

Assistant:

bool match(const QByteArray& data, const QString& pattern) {
    for(qint64 i = 0, idx = 0; (i <= (pattern.size() - 2)); i += 2, idx++) {
        if(idx >= data.size())
            return false;

#if QT_VERSION >= QT_VERSION_CHECK(6, 0, 0)
        QStringView hexb = QStringView{pattern}.mid(i, 2);
#else
        const QStringRef& hexb = pattern.midRef(i, 2);
#endif

        if(hexb == *WILDCARD_BYTE)
            continue;

        bool ok = false;
        auto b = static_cast<char>(hexb.toUInt(&ok, 16));
        if(!ok || (b != data.at(idx)))
            return false;
    }

    return true;
}